

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O1

vectype __thiscall
ChebTools::ChebyshevExpansion::y_Clenshaw_xscaled(ChebyshevExpansion *this,vectype *xscaled)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  undefined8 *puVar6;
  double dVar7;
  double dVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined8 uVar13;
  uint uVar14;
  Index index;
  void *__ptr;
  undefined8 *puVar15;
  void *__s;
  ulong uVar16;
  void *__ptr_00;
  Index index_3;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  char *pcVar20;
  long *in_RDX;
  long lVar21;
  ulong uVar22;
  Index extraout_RDX;
  DstEvaluatorType dstEvaluator;
  Index size_1;
  ulong uVar23;
  Index size;
  DstEvaluatorType dstEvaluator_1;
  vectype vVar24;
  ulong local_78;
  
  uVar22 = in_RDX[1];
  if (-1 < (long)uVar22) {
    lVar21 = (xscaled->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if (uVar22 == 0) {
      __ptr = (void *)0x0;
    }
    else {
      if (0x1fffffffffffffff < uVar22) {
LAB_0010665c:
        puVar15 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar15 = operator_new;
        __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      __ptr = malloc(uVar22 * 8);
      if (uVar22 != 1 && ((ulong)__ptr & 0xf) != 0) goto LAB_00106cd5;
      if (__ptr == (void *)0x0) goto LAB_0010665c;
    }
    uVar23 = in_RDX[1];
    if (-1 < (long)uVar23) {
      if (uVar23 == 0) {
        __s = (void *)0x0;
LAB_0010670e:
        if ((lVar21 < 1) ||
           ((xscaled->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows < lVar21)) {
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0xa3,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                       );
        }
        dVar7 = (xscaled->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data[lVar21 + -1];
        uVar16 = uVar22 & 0x7ffffffffffffffe;
        if (1 < (long)uVar22) {
          uVar17 = 0;
          do {
            pdVar1 = (double *)((long)__ptr + uVar17 * 8);
            *pdVar1 = dVar7;
            pdVar1[1] = dVar7;
            uVar17 = uVar17 + 2;
          } while (uVar17 < uVar16);
        }
        if ((long)uVar16 < (long)uVar22) {
          do {
            *(double *)((long)__ptr + uVar16 * 8) = dVar7;
            uVar16 = uVar16 + 1;
          } while (uVar22 != uVar16);
        }
        if (1 < (long)uVar23) {
          memset(__s,0,(uVar23 & 0x7ffffffffffffffe) * 8);
        }
        uVar14 = (int)lVar21 - 1;
        if ((long)(uVar23 & 0x7ffffffffffffffe) < (long)uVar23) {
          memset((void *)((uVar23 * 8 & 0xfffffffffffffff0) + (long)__s),0,
                 (ulong)((uint)(uVar23 * 8) & 8));
        }
        uVar16 = 0;
        if ((int)uVar14 < 2) {
          __ptr_00 = (void *)0x0;
        }
        else {
          uVar16 = 0;
          __ptr_00 = (void *)0x0;
          local_78 = (ulong)(uVar14 & 0x7fffffff);
          do {
            if (in_RDX[1] < 0) goto LAB_00106c2b;
            if (in_RDX[1] != uVar22) {
              pcVar20 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, 1>>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>]"
              ;
              goto LAB_00106cac;
            }
            if (uVar22 != uVar23) {
              pcVar20 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, 1>>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, 1>>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>]"
              ;
              goto LAB_00106cac;
            }
            if ((xscaled->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows < (long)local_78) goto LAB_00106c4a;
            if ((long)uVar23 < 0) goto LAB_00106c2b;
            dVar7 = (xscaled->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data[local_78 - 1];
            lVar21 = *in_RDX;
            if (uVar16 != uVar23) {
              free(__ptr_00);
              uVar16 = uVar23;
              if (uVar23 == 0) {
                __ptr_00 = (void *)0x0;
              }
              else {
                if (0x1fffffffffffffff < uVar23) {
LAB_00106cf4:
                  puVar15 = (undefined8 *)__cxa_allocate_exception(8);
                  *puVar15 = operator_new;
                  __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
                }
                __ptr_00 = malloc(uVar23 * 8);
                if (uVar23 != 1 && ((ulong)__ptr_00 & 0xf) != 0) goto LAB_00106cd5;
                if (__ptr_00 == (void *)0x0) goto LAB_00106cf4;
              }
            }
            if (uVar16 != uVar23) {
              pcVar20 = 
              "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, 1>>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>>, T1 = double, T2 = double]"
              ;
              goto LAB_00106ccb;
            }
            uVar17 = uVar16 - ((long)uVar16 >> 0x3f) & 0xfffffffffffffffe;
            if (1 < (long)uVar16) {
              lVar18 = 0;
              do {
                pdVar1 = (double *)(lVar21 + lVar18 * 8);
                dVar8 = *pdVar1;
                dVar10 = pdVar1[1];
                pdVar1 = (double *)((long)__ptr + lVar18 * 8);
                dVar11 = pdVar1[1];
                pdVar2 = (double *)((long)__s + lVar18 * 8);
                dVar12 = pdVar2[1];
                pdVar3 = (double *)((long)__ptr_00 + lVar18 * 8);
                *pdVar3 = ((dVar8 + dVar8) * *pdVar1 - *pdVar2) + dVar7;
                pdVar3[1] = ((dVar10 + dVar10) * dVar11 - dVar12) + dVar7;
                lVar18 = lVar18 + 2;
              } while (lVar18 < (long)uVar17);
            }
            if ((long)uVar17 < (long)uVar16) {
              do {
                dVar8 = *(double *)(lVar21 + uVar17 * 8);
                *(double *)((long)__ptr_00 + uVar17 * 8) =
                     ((dVar8 + dVar8) * *(double *)((long)__ptr + uVar17 * 8) -
                     *(double *)((long)__s + uVar17 * 8)) + dVar7;
                uVar17 = uVar17 + 1;
              } while (uVar16 != uVar17);
            }
            if (local_78 != 2) {
              if (uVar23 != uVar22) {
                if ((long)uVar22 < 0) goto LAB_00106d22;
                free(__s);
                uVar23 = uVar22;
                if (uVar22 == 0) {
                  __s = (void *)0x0;
                }
                else {
                  if (0x1fffffffffffffff < uVar22) {
LAB_00106d41:
                    puVar15 = (undefined8 *)__cxa_allocate_exception(8);
                    *puVar15 = operator_new;
                    __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
                  }
                  __s = malloc(uVar22 * 8);
                  if (uVar22 != 1 && ((ulong)__s & 0xf) != 0) goto LAB_00106cd5;
                  if (__s == (void *)0x0) goto LAB_00106d41;
                }
              }
              if (uVar23 == uVar22) {
                uVar17 = uVar23 & 0x7ffffffffffffffe;
                if (1 < (long)uVar23) {
                  uVar19 = 0;
                  do {
                    puVar15 = (undefined8 *)((long)__ptr + uVar19 * 8);
                    uVar13 = puVar15[1];
                    puVar6 = (undefined8 *)((long)__s + uVar19 * 8);
                    *puVar6 = *puVar15;
                    puVar6[1] = uVar13;
                    uVar19 = uVar19 + 2;
                  } while (uVar19 < uVar17);
                }
                if ((long)uVar17 < (long)uVar23) {
                  do {
                    *(undefined8 *)((long)__s + uVar17 * 8) =
                         *(undefined8 *)((long)__ptr + uVar17 * 8);
                    uVar17 = uVar17 + 1;
                  } while (uVar23 != uVar17);
                }
                if (uVar22 != uVar16) {
                  if ((long)uVar16 < 0) {
LAB_00106d22:
                    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                                  ,0x115,
                                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                                 );
                  }
                  free(__ptr);
                  uVar22 = uVar16;
                  if (uVar16 == 0) {
                    __ptr = (void *)0x0;
                  }
                  else {
                    if (0x1fffffffffffffff < uVar16) {
LAB_00106d6f:
                      puVar15 = (undefined8 *)__cxa_allocate_exception(8);
                      *puVar15 = operator_new;
                      __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
                    }
                    __ptr = malloc(uVar16 * 8);
                    if (uVar16 != 1 && ((ulong)__ptr & 0xf) != 0) goto LAB_00106cd5;
                    if (__ptr == (void *)0x0) goto LAB_00106d6f;
                  }
                }
                if (uVar22 == uVar16) {
                  uVar17 = uVar22 - ((long)uVar22 >> 0x3f) & 0xfffffffffffffffe;
                  if (1 < (long)uVar22) {
                    lVar21 = 0;
                    do {
                      puVar15 = (undefined8 *)((long)__ptr_00 + lVar21 * 8);
                      uVar13 = puVar15[1];
                      puVar6 = (undefined8 *)((long)__ptr + lVar21 * 8);
                      *puVar6 = *puVar15;
                      puVar6[1] = uVar13;
                      lVar21 = lVar21 + 2;
                    } while (lVar21 < (long)uVar17);
                  }
                  if ((long)uVar17 < (long)uVar22) {
                    do {
                      *(undefined8 *)((long)__ptr + uVar17 * 8) =
                           *(undefined8 *)((long)__ptr_00 + uVar17 * 8);
                      uVar17 = uVar17 + 1;
                    } while (uVar22 != uVar17);
                  }
                  goto LAB_00106ae8;
                }
              }
              pcVar20 = 
              "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
              ;
              goto LAB_00106ccb;
            }
LAB_00106ae8:
            bVar9 = 2 < (long)local_78;
            local_78 = local_78 - 1;
          } while (bVar9);
        }
        if (in_RDX[1] == uVar16) {
          if (uVar16 == uVar22) {
            if ((xscaled->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows < 1) {
LAB_00106c4a:
              __assert_fail("index >= 0 && index < size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                            ,0xb5,
                            "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                           );
            }
            if (-1 < (long)uVar22) {
              dVar7 = *(xscaled->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data;
              (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data = (double *)0x0;
              (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows = 0;
              Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                        ((DenseStorage<double,__1,__1,_1,_0> *)this,uVar22,uVar22,1);
              lVar21 = *in_RDX;
              if ((this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows != uVar22) {
                Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                          ((DenseStorage<double,__1,__1,_1,_0> *)this,uVar22,uVar22,1);
              }
              uVar23 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows;
              if (uVar23 == uVar22) {
                pdVar1 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data;
                uVar22 = uVar23 - ((long)uVar23 >> 0x3f) & 0xfffffffffffffffe;
                if (1 < (long)uVar23) {
                  lVar18 = 0;
                  do {
                    pdVar2 = (double *)(lVar21 + lVar18 * 8);
                    dVar8 = pdVar2[1];
                    pdVar3 = (double *)((long)__ptr_00 + lVar18 * 8);
                    dVar10 = pdVar3[1];
                    pdVar4 = (double *)((long)__ptr + lVar18 * 8);
                    dVar11 = pdVar4[1];
                    pdVar5 = pdVar1 + lVar18;
                    *pdVar5 = (*pdVar2 * *pdVar3 - *pdVar4) + dVar7;
                    pdVar5[1] = (dVar8 * dVar10 - dVar11) + dVar7;
                    lVar18 = lVar18 + 2;
                  } while (lVar18 < (long)uVar22);
                }
                if ((long)uVar22 < (long)uVar23) {
                  do {
                    pdVar1[uVar22] =
                         (*(double *)(lVar21 + uVar22 * 8) *
                          *(double *)((long)__ptr_00 + uVar22 * 8) -
                         *(double *)((long)__ptr + uVar22 * 8)) + dVar7;
                    uVar22 = uVar22 + 1;
                  } while (uVar23 != uVar22);
                }
                free(__s);
                free(__ptr);
                free(__ptr_00);
                vVar24.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = extraout_RDX;
                vVar24.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data = (double *)this;
                return (vectype)vVar24.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage;
              }
              pcVar20 = 
              "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>>, T1 = double, T2 = double]"
              ;
LAB_00106ccb:
              __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                            "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/AssignEvaluator.h"
                            ,0x2fd,pcVar20);
            }
LAB_00106c2b:
            __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                          ,0x4a,
                          "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Array<double, -1, 1>]"
                         );
          }
          pcVar20 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>]"
          ;
        }
        else {
          pcVar20 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>]"
          ;
        }
LAB_00106cac:
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseBinaryOp.h"
                      ,0x74,pcVar20);
      }
      if (uVar23 < 0x2000000000000000) {
        __s = malloc(uVar23 * 8);
        if (uVar23 != 1 && ((ulong)__s & 0xf) != 0) {
LAB_00106cd5:
          __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/util/Memory.h"
                        ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
        }
        if (__s != (void *)0x0) goto LAB_0010670e;
      }
      puVar15 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar15 = operator_new;
      __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                ,0x130,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

vectype ChebyshevExpansion::y_Clenshaw_xscaled(const vectype &xscaled) const {
        const std::size_t Norder = m_c.size() - 1;
        vectype u_k, u_kp1(xscaled.size()), u_kp2(xscaled.size());
        u_kp1.fill(m_c[Norder]); u_kp2.fill(0);
        for (int k = static_cast<int>(Norder) - 1; k >= 1; --k) {
            u_k = 2 * xscaled.array()*u_kp1.array() - u_kp2.array() + m_c(k);
            // Update summation values for all but the last step
            if (k > 1) {
                u_kp2 = u_kp1; u_kp1 = u_k;
            }
        }
        return xscaled.array()*u_k.array() - u_kp1.array() + m_c(0);
    }